

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O1

void mbedtls_mpi_core_cond_assign
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,size_t limbs,mbedtls_ct_condition_t assign)

{
  size_t i;
  size_t sVar1;
  
  if (limbs != 0 && X != A) {
    sVar1 = 0;
    do {
      X[sVar1] = X[sVar1] & ~assign | A[sVar1] & assign;
      sVar1 = sVar1 + 1;
    } while (limbs != sVar1);
  }
  return;
}

Assistant:

void mbedtls_mpi_core_cond_assign(mbedtls_mpi_uint *X,
                                  const mbedtls_mpi_uint *A,
                                  size_t limbs,
                                  mbedtls_ct_condition_t assign)
{
    if (X == A) {
        return;
    }

    /* This function is very performance-sensitive for RSA. For this reason
     * we have the loop below, instead of calling mbedtls_ct_memcpy_if
     * (this is more optimal since here we don't have to handle the case where
     * we copy awkwardly sized data).
     */
    for (size_t i = 0; i < limbs; i++) {
        X[i] = mbedtls_ct_mpi_uint_if(assign, A[i], X[i]);
    }
}